

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

void proto2_unittest::RecursiveGroup::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  ulong uVar2;
  void *pvVar3;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg != to_msg) {
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 1) != 0) {
      from_msg_00 = (MessageLite *)from_msg[1]._internal_metadata_.ptr_;
      if (from_msg_00 == (MessageLite *)0x0) goto LAB_001d041d;
      to_msg_00 = (MessageLite *)to_msg[1]._internal_metadata_.ptr_;
      if (to_msg_00 == (MessageLite *)0x0) {
        pvVar3 = google::protobuf::Arena::CopyConstruct<proto2_unittest::RecursiveGroup>
                           (arena,from_msg_00);
        to_msg[1]._internal_metadata_.ptr_ = (intptr_t)pvVar3;
      }
      else {
        MergeImpl(to_msg_00,from_msg_00);
      }
    }
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
    uVar2 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar2 & 1) == 0) {
      return;
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&to_msg->_internal_metadata_,(string *)((uVar2 & 0xfffffffffffffffe) + 8));
    return;
  }
  MergeImpl();
LAB_001d041d:
  MergeImpl((RecursiveGroup *)&stack0xffffffffffffffd8);
}

Assistant:

void RecursiveGroup::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<RecursiveGroup*>(&to_msg);
  auto& from = static_cast<const RecursiveGroup&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.RecursiveGroup)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    ABSL_DCHECK(from._impl_.recurse_ != nullptr);
    if (_this->_impl_.recurse_ == nullptr) {
      _this->_impl_.recurse_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.recurse_);
    } else {
      _this->_impl_.recurse_->MergeFrom(*from._impl_.recurse_);
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}